

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_copy_u_w_mips64(CPUMIPSState_conflict5 *env,uint32_t rd,uint32_t ws,uint32_t n)

{
  (env->active_tc).gpr[rd] =
       (ulong)*(uint *)((long)(env->active_fpu).fpr + (ulong)(n & 3) * 4 + (ulong)ws * 0x10);
  return;
}

Assistant:

void helper_msa_copy_u_w(CPUMIPSState *env, uint32_t rd,
                         uint32_t ws, uint32_t n)
{
    n %= 4;
#if defined(HOST_WORDS_BIGENDIAN)
    if (n < 2) {
        n = 2 - n - 1;
    } else {
        n = 6 - n - 1;
    }
#endif
    env->active_tc.gpr[rd] = (uint32_t)env->active_fpu.fpr[ws].wr.w[n];
}